

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_common.c
# Opt level: O0

lzma_ret lzma_raw_coder_init(lzma_next_coder *next,lzma_allocator *allocator,lzma_filter *options,
                            lzma_filter_find coder_find,_Bool is_encoder)

{
  long lVar1;
  lzma_filter_coder *plVar2;
  lzma_ret ret;
  lzma_filter_coder *fc_1;
  size_t i_1;
  lzma_filter_coder *fc;
  size_t j;
  size_t i;
  lzma_filter_info filters [5];
  lzma_filter_coder *plStack_40;
  lzma_ret ret_;
  size_t count;
  lzma_filter_find p_Stack_30;
  _Bool is_encoder_local;
  lzma_filter_find coder_find_local;
  lzma_filter *options_local;
  lzma_allocator *allocator_local;
  lzma_next_coder *next_local;
  
  count._7_1_ = is_encoder;
  p_Stack_30 = coder_find;
  coder_find_local = (lzma_filter_find)options;
  options_local = (lzma_filter *)allocator;
  allocator_local = (lzma_allocator *)next;
  next_local._4_4_ = validate_chain(options,(size_t *)&stack0xffffffffffffffc0);
  if (next_local._4_4_ == LZMA_OK) {
    if ((count._7_1_ & 1) == 0) {
      for (fc_1 = (lzma_filter_coder *)0x0; fc_1 < plStack_40;
          fc_1 = (lzma_filter_coder *)((long)&fc_1->id + 1)) {
        plVar2 = (*p_Stack_30)(*(lzma_vli *)(coder_find_local + (long)fc_1 * 0x10));
        if ((plVar2 == (lzma_filter_coder *)0x0) || (plVar2->init == (lzma_init_function)0x0)) {
          return LZMA_OPTIONS_ERROR;
        }
        filters[(long)((long)&fc_1[-1].memusage + 7)].options =
             *(void **)(coder_find_local + (long)fc_1 * 0x10);
        filters[(long)fc_1].id = (lzma_vli)plVar2->init;
        filters[(long)fc_1].init = *(lzma_init_function *)(coder_find_local + (long)fc_1 * 0x10 + 8)
        ;
      }
    }
    else {
      for (j = 0; j < plStack_40; j = j + 1) {
        lVar1 = (long)plStack_40 + (-1 - j);
        plVar2 = (*p_Stack_30)(*(lzma_vli *)(coder_find_local + j * 0x10));
        if ((plVar2 == (lzma_filter_coder *)0x0) || (plVar2->init == (lzma_init_function)0x0)) {
          return LZMA_OPTIONS_ERROR;
        }
        filters[lVar1 + -1].options = *(void **)(coder_find_local + j * 0x10);
        filters[lVar1].id = (lzma_vli)plVar2->init;
        filters[lVar1].init = *(lzma_init_function *)(coder_find_local + j * 0x10 + 8);
      }
    }
    filters[(long)((long)&plStack_40[-1].memusage + 7)].options = (void *)0xffffffffffffffff;
    filters[(long)plStack_40].id = 0;
    next_local._4_4_ =
         lzma_next_filter_init
                   ((lzma_next_coder *)allocator_local,(lzma_allocator *)options_local,
                    (lzma_filter_info *)&i);
    if (next_local._4_4_ != LZMA_OK) {
      lzma_next_end((lzma_next_coder *)allocator_local,(lzma_allocator *)options_local);
    }
  }
  return next_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_raw_coder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_filter *options,
		lzma_filter_find coder_find, bool is_encoder)
{
	// Do some basic validation and get the number of filters.
	size_t count;
	return_if_error(validate_chain(options, &count));

	// Set the filter functions and copy the options pointer.
	lzma_filter_info filters[LZMA_FILTERS_MAX + 1];
	if (is_encoder) {
		for (size_t i = 0; i < count; ++i) {
			// The order of the filters is reversed in the
			// encoder. It allows more efficient handling
			// of the uncompressed data.
			const size_t j = count - i - 1;

			const lzma_filter_coder *const fc
					= coder_find(options[i].id);
			if (fc == NULL || fc->init == NULL)
				return LZMA_OPTIONS_ERROR;

			filters[j].id = options[i].id;
			filters[j].init = fc->init;
			filters[j].options = options[i].options;
		}
	} else {
		for (size_t i = 0; i < count; ++i) {
			const lzma_filter_coder *const fc
					= coder_find(options[i].id);
			if (fc == NULL || fc->init == NULL)
				return LZMA_OPTIONS_ERROR;

			filters[i].id = options[i].id;
			filters[i].init = fc->init;
			filters[i].options = options[i].options;
		}
	}

	// Terminate the array.
	filters[count].id = LZMA_VLI_UNKNOWN;
	filters[count].init = NULL;

	// Initialize the filters.
	const lzma_ret ret = lzma_next_filter_init(next, allocator, filters);
	if (ret != LZMA_OK)
		lzma_next_end(next, allocator);

	return ret;
}